

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

void TestBlockWrite(uint wlen_max,AmpIO *wboard,AmpIO *rboard)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  quadlet_t qVar4;
  quadlet_t qVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ostream *poVar9;
  long lVar10;
  uint offset;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  double dVar18;
  uint local_1094;
  uint local_108c;
  uint local_1074;
  quadlet_t waveform_read [512];
  quadlet_t waveform [512];
  
  uVar8 = BoardIO::GetFpgaVersionMajor((BoardIO *)rboard);
  if ((uVar8 & 0xfffffffe) != 2) {
    poVar9 = std::operator<<((ostream *)&std::cout,"TestBlockWrite: unsupported FPGA Version: ");
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::endl<char,std::char_traits<char>>(poVar9);
    return;
  }
  bVar6 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,waveform_read,0x80,0x10);
  bVar1 = true;
  if (bVar6) {
    if (waveform_read[0] == 0x32474244) {
      bVar1 = false;
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"Debug data not available");
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cout,"Will only perform read/write test");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  offset = 0x4a0;
  if (uVar8 == 2) {
    offset = 0x90;
  }
  lVar15 = 0;
  uVar14 = 2;
  local_1074 = 0x20000;
  iVar11 = 0;
  local_108c = 0;
  local_1094 = wlen_max;
  do {
    if (wlen_max <= uVar14) {
LAB_00107752:
      if (iVar11 != 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,"There were ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," additional lengths with mismatches");
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      if (!bVar1) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Mininum bw_left = ");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," at wlen = ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<((ostream *)&std::cout,"Maximum bw_wait = ");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        poVar9 = std::operator<<(poVar9," at wlen = ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
LAB_00107837:
        std::endl<char,std::char_traits<char>>(poVar9);
      }
      return;
    }
    bVar6 = uVar14 < 10;
    bVar16 = (int)((uVar14 & 0xffffffff) % 0x14) != 0;
    bVar17 = uVar14 == wlen_max - 1;
    if (uVar8 == 2) {
      dVar18 = (double)((int)uVar14 * 3 - 2) / 5.0;
    }
    else {
      dVar18 = (double)((int)uVar14 - 1) * 0.5;
    }
    if (!bVar16 || (bVar17 || bVar6)) {
      poVar9 = std::operator<<((ostream *)&std::cout,"Len=");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,": ");
      if (!bVar1) {
        std::operator<<((ostream *)&std::cout,"trigger = ");
        poVar9 = std::ostream::_M_insert<double>(dVar18);
        poVar9 = std::operator<<(poVar9,", trigger_fpga = ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9,", ");
      }
    }
    lVar10 = 0;
    uVar13 = uVar14;
    uVar12 = local_1074;
    while (uVar13 != 0) {
      *(undefined4 *)((long)waveform_read + lVar10) = 0;
      *(uint *)((long)waveform + lVar10) = (uint)uVar13 | uVar12;
      uVar12 = uVar12 + 0x10000;
      lVar10 = lVar10 + 4;
      uVar13 = uVar13 - 1;
    }
    bVar7 = AmpIO::WriteWaveformTable(wboard,waveform,0,(unsigned_short)uVar14);
    if (!bVar7) {
      if (bVar16 && (!bVar17 && !bVar6)) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Len=");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9,": ");
      }
      poVar9 = std::operator<<((ostream *)&std::cout,"WriteWaveformTable failed");
      goto LAB_00107837;
    }
    Amp1394_Sleep(0.05);
    if (!bVar1) {
      bVar7 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,waveform_read,0x80,0x10);
      if ((!bVar7) ||
         (bVar7 = FpgaIO::ReadEthernetData(&rboard->super_FpgaIO,waveform_read + 0x10,offset,5),
         qVar5 = waveform_read[0x14], qVar4 = waveform_read[8], !bVar7)) goto LAB_00107752;
      if (waveform_read[8] >> 0x10 < local_1094) {
        local_1094 = waveform_read[8] >> 0x10;
      }
      if (local_108c < waveform_read[0x14] >> 0x10) {
        local_108c = waveform_read[0x14] >> 0x10;
      }
      if (!bVar16 || (bVar17 || bVar6)) {
        poVar9 = std::operator<<((ostream *)&std::cout,"bw_left = ");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,(ushort)(qVar4 >> 0x10));
        poVar9 = std::operator<<(poVar9,", bw_wait = ");
        std::ostream::operator<<(poVar9,(ushort)(qVar5 >> 0x10));
        if ((short)qVar4 < 0) {
          poVar9 = std::operator<<((ostream *)&std::cout,", bw_err_cnt = ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        }
        std::operator<<((ostream *)&std::cout,", ");
      }
    }
    bVar7 = AmpIO::ReadWaveformTable(rboard,waveform_read,0,(unsigned_short)uVar14);
    if (!bVar7) {
      if (bVar16 && (!bVar17 && !bVar6)) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Len=");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9,": ");
      }
      poVar9 = std::operator<<((ostream *)&std::cout,"ReadWaveformTable failed");
      std::endl<char,std::char_traits<char>>(poVar9);
      goto LAB_00107752;
    }
    lVar10 = -1;
    do {
      if (lVar10 + lVar15 == 1) {
        if (bVar16 && (!bVar17 && !bVar6)) goto LAB_00107669;
        if (bVar1) {
          std::operator<<((ostream *)&std::cout," Pass");
        }
        goto LAB_0010765e;
      }
      lVar2 = lVar10 + 1;
      lVar3 = lVar10 + 1;
      lVar10 = lVar10 + 1;
    } while (waveform_read[lVar2] == waveform[lVar3]);
    if (bVar16 && (!bVar17 && !bVar6)) {
      iVar11 = iVar11 + 1;
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"mismatch at quadlet ");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,", read ");
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9,", expected ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      bVar6 = iVar11 != 0;
      iVar11 = 0;
      if (bVar6) {
        poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar9 = std::operator<<(poVar9,"There were ");
        *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
             *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9," additional lengths with mismatches");
      }
LAB_0010765e:
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
LAB_00107669:
    uVar14 = uVar14 + 1;
    local_1074 = local_1074 + 0x10000;
    lVar15 = lVar15 + -1;
  } while( true );
}

Assistant:

void TestBlockWrite(unsigned int wlen_max, AmpIO *wboard, AmpIO *rboard)
{
    quadlet_t waveform[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    quadlet_t waveform_read[MAX_POSSIBLE_DATA_SIZE/sizeof(quadlet_t)];
    unsigned int i;
    unsigned int min_left = wlen_max;
    unsigned int min_wlen = wlen_max;
    unsigned int max_wait = 0;
    unsigned int max_wlen = wlen_max;
    unsigned int numSilentMismatch = 0;

    // Get FPGA Version
    unsigned int fpgaVer = rboard->GetFpgaVersionMajor();
    if ((fpgaVer < 2) || (fpgaVer > 3)) {
        std::cout << "TestBlockWrite: unsupported FPGA Version: " << fpgaVer << std::endl;
        return;
    }

    // Check if debug data available, in which case we can query bw_left
    unsigned int debugVersion = 0;
    if (rboard->ReadEthernetData(waveform_read, 0x80, 16)) {
        char *cptr = reinterpret_cast<char *>(waveform_read);
        if (strncmp(cptr, "DBG2", 4) == 0) {
            debugVersion = 2;
        }
        else {
            std::cout << "Debug data not available" << std::endl;
            std::cout << "Will only perform read/write test" << std::endl;
        }
    }

    for (unsigned int wlen = 2; wlen < wlen_max; wlen++) {
        bool doOut = ((wlen<10)||(wlen%20 == 0)||(wlen==wlen_max-1));
        unsigned int len16 = 2*wlen;  // length in words
        double trigger;               // actual trigger value
        unsigned int trigger_comp;    // trigger computation on FPGA
        if (fpgaVer == 2) {
            trigger_comp = 10 + len16/2+len16/8-len16/64 + 2; // FPGA V2 (KSZ8851)
            trigger = (3*wlen-2)/5.0;
        }
        else {
            trigger_comp = 10 + len16/2 + 2;   // FPGA V3 (RTL8211F)
            trigger = (wlen-1)/2.0;
        }
        if (doOut) {
            std::cout << "Len=" << std::dec << wlen << ": ";
            if (debugVersion) {
                std::cout << "trigger = " << trigger
                          << ", trigger_fpga = " << (trigger_comp-10)/2 << ", ";
            }
        }
        for (i = 0; i < wlen; i++) {
            waveform[i] = ((wlen+i)<< 16) | (wlen-i);
            waveform_read[i] = 0;
        }
        if (!wboard->WriteWaveformTable(waveform, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "WriteWaveformTable failed" << std::endl;
            return;
        }
        Amp1394_Sleep(0.05);
        if (debugVersion) {
            // Read 16 quadlets to get EthernetIO debug data (0x80-0x8f)
            if (!rboard->ReadEthernetData(waveform_read, 0x80, 16))
                break;
            // Read next 5 quadlets to get low-level debug data:
            // KSZ (0x90) or RTI (0x4a0)
            if (!rboard->ReadEthernetData(&waveform_read[16], (fpgaVer == 2) ? 0x90 : 0x4a0, 5))
                break;
            unsigned short bw_left = 0;
            unsigned short bw_wait = 0;
            unsigned int bw_err_cnt = 0;
            bw_left = static_cast<unsigned short>(waveform_read[8]>>16);
            bool bw_err = (waveform_read[8] & 0x00008000);
            if (bw_err) {
                bw_err_cnt++;
            }
            // For both KSZ and RTI, bw_wait is upper word of DebugData[4]
            bw_wait = static_cast<unsigned short>(waveform_read[20]>>16);
            if (bw_left < min_left) {
                min_left = bw_left;
                min_wlen = wlen;
            }
            if (bw_wait > max_wait) {
                max_wait = bw_wait;
                max_wlen = wlen;
            }
            if (doOut) {
                std::cout << "bw_left = " << bw_left << ", bw_wait = " << bw_wait;
                if (bw_err_cnt > 0) {
                    std::cout << ", bw_err_cnt = " << bw_err_cnt;
                    bw_err_cnt = 0;
                }
                std::cout << ", ";
            }
        }
        if (!rboard->ReadWaveformTable(waveform_read, 0, wlen)) {
            if (!doOut) std::cout << "Len=" << std::dec << wlen << ": ";
            std::cout << "ReadWaveformTable failed" << std::endl;
            break;
        }
        bool allOK = true;
        for (i = 0; i < wlen; i++) {
            if (waveform_read[i] != waveform[i]) {
                allOK = false;
                if (doOut) {
                    std::cout << "mismatch at quadlet " << std::dec << i << ", read "
                              << std::hex << waveform_read[i] << ", expected " << waveform[i];
                    if (numSilentMismatch > 0) {
                        std::cout << std::endl << "There were " << std::dec << numSilentMismatch
                                  << " additional lengths with mismatches";
                        numSilentMismatch = 0;
                    }
                }
                else
                    numSilentMismatch++;
                break;
            }
        }
        if (doOut) {
            if (!debugVersion && allOK) std::cout << " Pass";
            std::cout << std::endl;
        }
    }
    if (numSilentMismatch > 0) {
        std::cout << "There were " << numSilentMismatch << " additional lengths with mismatches" << std::endl;
    }
    if (debugVersion) {
        std::cout << "Mininum bw_left = " << std::dec << min_left << " at wlen = " << min_wlen << std::endl;
        std::cout << "Maximum bw_wait = " << std::dec << max_wait << " at wlen = " << max_wlen << std::endl;
    }
}